

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_version_negotiation_packet(quicly_conn_t *conn,quicly_decoded_packet_t *packet)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  int iVar5;
  uint *puVar6;
  uint uVar7;
  
  sVar1 = (packet->octets).len;
  sVar2 = packet->encrypted_off;
  iVar5 = 0x2000a;
  if ((sVar1 != sVar2) && (((int)sVar1 - (int)sVar2 & 3U) == 0)) {
    uVar4 = 0;
    if (sVar1 != sVar2) {
      puVar3 = (packet->octets).base;
      puVar6 = (uint *)(puVar3 + sVar2);
      uVar4 = 0;
      do {
        uVar7 = *puVar6;
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        if (uVar7 == 0xff00001b) {
          if (uVar4 == 0) {
            uVar4 = 0xff00001b;
          }
        }
        else if (uVar7 == 0xff00001d) {
          uVar4 = 0xff00001d;
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != (uint *)(puVar3 + sVar1));
    }
    if (uVar4 == 0) {
      iVar5 = handle_close(conn,0xff05,0xffffffffffffffff,(ptls_iovec_t)ZEXT816(0x12c0a2));
      return iVar5;
    }
    (conn->super).version = uVar4;
    iVar5 = reinstall_initial_encryption(conn,0x203);
    if (iVar5 == 0) {
      iVar5 = discard_sentmap_by_epoch(conn,0xffffffff);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

static int handle_version_negotiation_packet(quicly_conn_t *conn, quicly_decoded_packet_t *packet)
{
    const uint8_t *src = packet->octets.base + packet->encrypted_off, *end = packet->octets.base + packet->octets.len;
    uint32_t selected_version = 0;

    if (src == end || (end - src) % 4 != 0)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* select in the precedence of _CURRENT -> _DRAFT27 -> fail */
    while (src != end) {
        uint32_t supported_version = quicly_decode32(&src);
        switch (supported_version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
            selected_version = QUICLY_PROTOCOL_VERSION_CURRENT;
            break;
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            if (selected_version == 0)
                selected_version = QUICLY_PROTOCOL_VERSION_DRAFT27;
            break;
        }
    }
    if (selected_version == 0)
        return handle_close(conn, QUICLY_ERROR_NO_COMPATIBLE_VERSION, UINT64_MAX, ptls_iovec_init("", 0));

    return negotiate_using_version(conn, selected_version);
}